

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*,slang::syntax::DefaultExtendsClauseArgSyntax*>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,ArgumentListSyntax **args_2,
          DefaultExtendsClauseArgSyntax **args_3)

{
  Token keyword;
  ExtendsClauseSyntax *this_00;
  
  this_00 = (ExtendsClauseSyntax *)allocate(this,0x40,8);
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  slang::syntax::ExtendsClauseSyntax::ExtendsClauseSyntax(this_00,keyword,args_1,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }